

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_defer_push_task_fn(fio_defer_task_s task,fio_task_queue_s *queue)

{
  size_t sVar1;
  fio_defer_queue_block_s *pfVar2;
  fio_defer_task_s *pfVar3;
  int *piVar4;
  fio_task_queue_s *queue_local;
  
  fio_lock(&queue->lock);
  if ((queue->writer->state != '\0') && (queue->writer->write == queue->writer->read)) {
    if ((queue->static_queue).state == '\x02') {
      queue->writer->next = &queue->static_queue;
    }
    else {
      pfVar2 = (fio_defer_queue_block_s *)fio_malloc(0xfe0);
      queue->writer->next = pfVar2;
      if (queue->writer->next == (fio_defer_queue_block_s *)0x0) {
        fio_unlock(&queue->lock);
        if (0 < FIO_LOG_LEVEL) {
          FIO_LOG2STDERR(
                        "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.c:920"
                        );
        }
        kill(0,2);
        piVar4 = __errno_location();
        exit(*piVar4);
      }
    }
    queue->writer = queue->writer->next;
    queue->writer->write = 0;
    queue->writer->read = 0;
    queue->writer->state = '\0';
    queue->writer->next = (fio_defer_queue_block_s *)0x0;
  }
  pfVar2 = queue->writer;
  sVar1 = queue->writer->write;
  queue->writer->write = sVar1 + 1;
  pfVar3 = pfVar2->tasks + sVar1;
  pfVar3->func = task.func;
  pfVar3->arg1 = task.arg1;
  pfVar3->arg2 = task.arg2;
  if (queue->writer->write == 0xa8) {
    queue->writer->write = 0;
    queue->writer->state = '\x01';
  }
  fio_unlock(&queue->lock);
  return;
}

Assistant:

static inline void fio_defer_push_task_fn(fio_defer_task_s task,
                                          fio_task_queue_s *queue) {
  fio_lock(&queue->lock);

  /* test if full */
  if (queue->writer->state && queue->writer->write == queue->writer->read) {
    /* return to static buffer or allocate new buffer */
    if (queue->static_queue.state == 2) {
      queue->writer->next = &queue->static_queue;
    } else {
      queue->writer->next = fio_malloc(sizeof(*queue->writer->next));
      COUNT_ALLOC;
      if (!queue->writer->next)
        goto critical_error;
    }
    queue->writer = queue->writer->next;
    queue->writer->write = 0;
    queue->writer->read = 0;
    queue->writer->state = 0;
    queue->writer->next = NULL;
  }

  /* place task and finish */
  queue->writer->tasks[queue->writer->write++] = task;
  /* cycle buffer */
  if (queue->writer->write == DEFER_QUEUE_BLOCK_COUNT) {
    queue->writer->write = 0;
    queue->writer->state = 1;
  }
  fio_unlock(&queue->lock);
  return;

critical_error:
  fio_unlock(&queue->lock);
  FIO_ASSERT_ALLOC(NULL)
}